

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

Value * __thiscall
minja::Expression::evaluate
          (Value *__return_storage_ptr__,Expression *this,shared_ptr<minja::Context> *context)

{
  ostringstream out;
  
  (**this->_vptr_Expression)();
  return __return_storage_ptr__;
}

Assistant:

Value evaluate(const std::shared_ptr<Context> & context) const {
        try {
            return do_evaluate(context);
        } catch (const std::exception & e) {
            std::ostringstream out;
            out << e.what();
            if (location.source) out << error_location_suffix(*location.source, location.pos);
            throw std::runtime_error(out.str());
        }
    }